

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstracteventdispatcher.cpp
# Opt level: O2

QList<QAbstractEventDispatcher::TimerInfo> * __thiscall
QAbstractEventDispatcherV2::registeredTimers
          (QList<QAbstractEventDispatcher::TimerInfo> *__return_storage_ptr__,
          QAbstractEventDispatcherV2 *this,QObject *object)

{
  long lVar1;
  iterator iVar2;
  iterator iVar3;
  long lVar4;
  long in_FS_OFFSET;
  int local_60;
  TimerId local_5c;
  QArrayDataPointer<QAbstractEventDispatcher::TimerInfoV2> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d._0_4_ = 0xaaaaaaaa;
  local_58.d._4_4_ = 0xaaaaaaaa;
  local_58.ptr._0_4_ = 0xaaaaaaaa;
  local_58.ptr._4_4_ = 0xaaaaaaaa;
  (**(code **)(*(long *)this + 0xd0))(&local_58);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (TimerInfo *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QList<QAbstractEventDispatcher::TimerInfo>::reserve(__return_storage_ptr__,local_58.size);
  iVar2 = QList<QAbstractEventDispatcher::TimerInfoV2>::begin
                    ((QList<QAbstractEventDispatcher::TimerInfoV2> *)&local_58);
  iVar3 = QList<QAbstractEventDispatcher::TimerInfoV2>::end
                    ((QList<QAbstractEventDispatcher::TimerInfoV2> *)&local_58);
  for (; iVar2.i != iVar3.i; iVar2.i = iVar2.i + 1) {
    local_5c = (iVar2.i)->timerId;
    lVar1 = ((iVar2.i)->interval).__r;
    lVar4 = lVar1 / 1000000;
    lVar4 = (ulong)(lVar4 * 1000000 < lVar1) + lVar4;
    if (0x7ffffffe < lVar4) {
      lVar4 = 0x7fffffff;
    }
    if (lVar4 < -0x7fffffff) {
      lVar4 = -0x80000000;
    }
    local_60 = (int)lVar4;
    QList<QAbstractEventDispatcher::TimerInfo>::emplaceBack<int,int,Qt::TimerType_const&>
              (__return_storage_ptr__,(int *)&local_5c,&local_60,&(iVar2.i)->timerType);
  }
  QArrayDataPointer<QAbstractEventDispatcher::TimerInfoV2>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

auto QAbstractEventDispatcherV2::registeredTimers(QObject *object) const -> QList<TimerInfo>
{
    auto self = static_cast<const QAbstractEventDispatcherV2 *>(this);
    QList<TimerInfoV2> timers = self->timersForObject(object);
    QList<TimerInfo> result;
    result.reserve(timers.size());
    for (const TimerInfoV2 &t : timers)
        result.emplaceBack(qToUnderlying(t.timerId), fromDuration<int>(t.interval), t.timerType);
    return result;
}